

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_first_byte,bool want_earliest_match,
          bool run_forward)

{
  size_t sVar1;
  byte bVar2;
  const_pointer pcVar3;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  byte *pbVar7;
  void *pvVar8;
  State *pSVar9;
  State *state;
  State *pSVar10;
  byte *__s;
  byte *pbVar11;
  undefined7 in_register_00000011;
  uint c;
  size_t sVar12;
  ulong uVar13;
  undefined3 in_register_00000081;
  long lVar14;
  StateSaver save_start;
  StateSaver save_s;
  ulong local_250;
  ulong local_240;
  byte *local_230;
  StateSaver local_220;
  byte *local_1f8;
  undefined4 local_1ec;
  StateSaver local_1e8;
  ulong local_1c0;
  Prog *local_1b8;
  LogMessage local_1b0;
  
  local_1ec = (undefined4)CONCAT71(in_register_00000011,have_first_byte);
  pbVar7 = (byte *)(params->text).data_;
  __s = pbVar7 + (params->text).size_;
  if (CONCAT31(in_register_00000081,run_forward) == 0) {
    __s = pbVar7;
    pbVar7 = pbVar7 + (params->text).size_;
  }
  pSVar10 = params->start;
  local_1b8 = this->prog_;
  if ((pSVar10->flag_ & 0x100) == 0) {
    local_230 = (byte *)0x0;
    local_240 = 0;
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar10->ninst_)) {
      lVar14 = (long)pSVar10->ninst_ + 1;
      do {
        if (pSVar10->inst_[lVar14 + -2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar10->inst_[lVar14 + -2]);
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    local_240 = 1;
    local_230 = pbVar7;
    if (want_earliest_match) {
      params->ep = (char *)pbVar7;
LAB_001c1637:
      local_250._0_1_ = 1;
      goto LAB_001c1649;
    }
  }
  local_250 = -(ulong)run_forward | 1;
  local_1f8 = (byte *)0x0;
  state = pSVar10;
  local_1c0 = local_250;
  do {
    pbVar11 = pbVar7;
    if ((long)pbVar7 - (long)__s == 0) goto LAB_001c1432;
    if (((char)local_1ec != '\0') && (state == pSVar10)) {
      pbVar11 = __s;
      if (run_forward) {
        pbVar7 = (byte *)memchr(pbVar7,params->first_byte,(long)__s - (long)pbVar7);
        if (pbVar7 == (byte *)0x0) {
LAB_001c1432:
          pcVar3 = (params->text).data_;
          if (run_forward) {
            pbVar7 = (byte *)(pcVar3 + (params->text).size_);
            if (pbVar7 == (byte *)((params->context).data_ + (params->context).size_))
            goto LAB_001c145d;
LAB_001c1458:
            c = (uint)*pbVar7;
          }
          else {
            if (pcVar3 != (params->context).data_) {
              pbVar7 = (byte *)(pcVar3 + -1);
              goto LAB_001c1458;
            }
LAB_001c145d:
            c = 0x100;
          }
          if (c == 0x100) {
            uVar6 = this->prog_->bytemap_range_;
          }
          else {
            uVar6 = (uint)this->prog_->bytemap_[c];
          }
          pSVar10 = (State *)(&state[1].inst_)[(int)uVar6];
          if ((pSVar10 == (State *)0x0) &&
             (pSVar10 = RunStateOnByteUnlocked(this,state,c), pSVar10 == (State *)0x0)) {
            if (state < (State *)0x3) {
              local_220.inst_ = (int *)0x0;
              local_220.ninst_ = 0;
              local_220.flag_ = 0;
              local_220.is_special_ = true;
              local_220.dfa_ = this;
              local_220.special_ = state;
            }
            else {
              local_220.is_special_ = false;
              local_220.special_ = (State *)0x0;
              local_220.ninst_ = state->ninst_;
              local_220.flag_ = state->flag_;
              sVar1 = (long)state->ninst_ * 4;
              uVar13 = 0xffffffffffffffff;
              if (-1 < (long)state->ninst_) {
                uVar13 = sVar1;
              }
              local_220.dfa_ = this;
              local_220.inst_ = (int *)operator_new__(uVar13);
              memmove(local_220.inst_,state->inst_,sVar1);
            }
            ResetCache(this,params->cache_lock);
            pSVar10 = StateSaver::Restore(&local_220);
            if (pSVar10 == (State *)0x0) {
LAB_001c158f:
              params->failed = true;
              bVar4 = false;
              pSVar10 = (State *)0x0;
              local_250._0_1_ = 0;
            }
            else {
              pSVar10 = RunStateOnByteUnlocked(this,pSVar10,c);
              if (pSVar10 == (State *)0x0) {
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                           ,0x5f6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0.str_,"RunStateOnByteUnlocked failed after Reset",
                           0x29);
                LogMessage::~LogMessage(&local_1b0);
                goto LAB_001c158f;
              }
              bVar4 = true;
            }
            if ((local_220.is_special_ == false) && (local_220.inst_ != (int *)0x0)) {
              operator_delete__(local_220.inst_);
            }
            if (!bVar4) break;
          }
          if (pSVar10 < (State *)0x3) {
            if (pSVar10 == (State *)0x1) goto LAB_001c163b;
            params->ep = (char *)__s;
            goto LAB_001c1637;
          }
          if (((((pSVar10->flag_ & 0x100) == 0) ||
               (local_240._0_1_ = 1, local_230 = pbVar11, params->matches == (SparseSet *)0x0)) ||
              (this->kind_ != kManyMatch)) || ((long)pSVar10->ninst_ < 1)) goto LAB_001c163b;
          lVar14 = (long)pSVar10->ninst_ + 1;
          goto LAB_001c15f9;
        }
      }
      else {
        pvVar8 = memrchr(__s,params->first_byte,(long)pbVar7 - (long)__s);
        if (pvVar8 == (void *)0x0) goto LAB_001c1432;
        pbVar7 = (byte *)((long)pvVar8 + 1);
      }
    }
    pbVar11 = pbVar7 + -1;
    pbVar5 = pbVar11;
    if (run_forward) {
      pbVar11 = pbVar7;
      pbVar5 = pbVar7 + 1;
    }
    pbVar7 = pbVar5;
    bVar2 = *pbVar11;
    pSVar9 = (State *)(&state[1].inst_)[local_1b8->bytemap_[bVar2]];
    if (pSVar9 == (State *)0x0) {
      pSVar9 = RunStateOnByteUnlocked(this,state,(uint)bVar2);
      if (pSVar9 != (State *)0x0) goto LAB_001c111b;
      if (((dfa_should_bail_when_slow == '\x01') && (local_1f8 != (byte *)0x0)) &&
         (((ulong)((long)pbVar7 - (long)local_1f8) < (this->state_cache_)._M_h._M_element_count * 10
          && (this->kind_ != kManyMatch)))) {
        params->failed = true;
        bVar4 = false;
        local_250 = 0;
        pSVar9 = state;
      }
      else {
        if (pSVar10 < (State *)0x3) {
          local_220.inst_ = (int *)0x0;
          local_220.ninst_ = 0;
          local_220.flag_ = 0;
          local_220.is_special_ = true;
          local_220.dfa_ = this;
          local_220.special_ = pSVar10;
        }
        else {
          local_220.is_special_ = false;
          local_220.special_ = (State *)0x0;
          local_220.ninst_ = pSVar10->ninst_;
          local_220.flag_ = pSVar10->flag_;
          sVar1 = (long)pSVar10->ninst_ * 4;
          sVar12 = sVar1;
          if ((long)pSVar10->ninst_ < 0) {
            sVar12 = 0xffffffffffffffff;
          }
          local_220.dfa_ = this;
          local_220.inst_ = (int *)operator_new__(sVar12);
          memmove(local_220.inst_,pSVar10->inst_,sVar1);
        }
        local_1e8.dfa_ = this;
        if (state < (State *)0x3) {
          local_1e8.inst_ = (int *)0x0;
          local_1e8.ninst_ = 0;
          local_1e8.flag_ = 0;
          local_1e8.is_special_ = true;
          local_1e8.special_ = state;
        }
        else {
          local_1e8.is_special_ = false;
          local_1e8.special_ = (State *)0x0;
          local_1e8.ninst_ = state->ninst_;
          local_1e8.flag_ = state->flag_;
          sVar1 = (long)state->ninst_ * 4;
          sVar12 = sVar1;
          if ((long)state->ninst_ < 0) {
            sVar12 = 0xffffffffffffffff;
          }
          local_1e8.inst_ = (int *)operator_new__(sVar12);
          memmove(local_1e8.inst_,state->inst_,sVar1);
        }
        ResetCache(this,params->cache_lock);
        pSVar10 = StateSaver::Restore(&local_220);
        if (pSVar10 == (State *)0x0) {
LAB_001c13c9:
          params->failed = true;
          bVar4 = false;
          pSVar9 = (State *)0x0;
          local_250 = 0;
        }
        else {
          state = StateSaver::Restore(&local_1e8);
          if (state == (State *)0x0) {
            state = (State *)0x0;
            goto LAB_001c13c9;
          }
          pSVar9 = RunStateOnByteUnlocked(this,state,(uint)bVar2);
          if (pSVar9 == (State *)0x0) {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                       ,0x5ad);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"RunStateOnByteUnlocked failed after ResetCache",
                       0x2e);
            LogMessage::~LogMessage(&local_1b0);
            goto LAB_001c13c9;
          }
          bVar4 = true;
        }
        if ((local_1e8.is_special_ == false) && (local_1e8.inst_ != (int *)0x0)) {
          operator_delete__(local_1e8.inst_);
        }
        if ((local_220.is_special_ == false) && (local_220.inst_ != (int *)0x0)) {
          operator_delete__(local_220.inst_);
        }
        local_1f8 = pbVar7;
        if (bVar4) goto LAB_001c111b;
        bVar4 = false;
        pSVar9 = state;
      }
    }
    else {
LAB_001c111b:
      if (pSVar9 < (State *)0x3) {
        if (pSVar9 == (State *)0x1) {
          params->ep = (char *)local_230;
LAB_001c11d8:
          bVar4 = false;
          pSVar9 = state;
          local_250 = local_240;
        }
        else {
          params->ep = (char *)__s;
          local_250 = 1;
          bVar4 = false;
          pSVar9 = state;
        }
      }
      else {
        bVar4 = true;
        if ((pSVar9->flag_ & 0x100) != 0) {
          if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
             (0 < (long)pSVar9->ninst_)) {
            lVar14 = (long)pSVar9->ninst_ + 1;
            do {
              if (pSVar9->inst_[lVar14 + -2] == -2) break;
              SparseSetT<void>::InsertInternal(params->matches,true,pSVar9->inst_[lVar14 + -2]);
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          local_230 = pbVar7 + local_1c0;
          local_240 = 1;
          if (want_earliest_match) {
            params->ep = (char *)local_230;
            local_240 = 1;
            state = pSVar9;
            goto LAB_001c11d8;
          }
          bVar4 = true;
        }
      }
    }
    state = pSVar9;
  } while (bVar4);
  goto LAB_001c1649;
  while( true ) {
    SparseSetT<void>::InsertInternal(params->matches,true,pSVar10->inst_[lVar14 + -2]);
    lVar14 = lVar14 + -1;
    if (lVar14 < 2) break;
LAB_001c15f9:
    if (pSVar10->inst_[lVar14 + -2] == -2) break;
  }
LAB_001c163b:
  params->ep = (char *)local_230;
  local_250._0_1_ = (byte)local_240;
LAB_001c1649:
  return (bool)((byte)local_250 & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_first_byte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;
  if (ExtraDebug)
    fprintf(stderr, "@stx: %s\n", DumpState(s).c_str());

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @stx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (ExtraDebug)
      fprintf(stderr, "@%td: %s\n",
              p - bp, DumpState(s).c_str());

    if (have_first_byte && s == start) {
      // In start state, only way out is to find first_byte,
      // so use optimized assembly in memchr to skip ahead.
      // If first_byte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->first_byte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->first_byte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (ExtraDebug)
        fprintf(stderr, "match @%td! [%s]\n",
                lastmatch - bp, DumpState(s).c_str());
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  if (ExtraDebug)
    fprintf(stderr, "@etx: %s\n", DumpState(s).c_str());

  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @etx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}